

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

string * __thiscall
serial::Serial::readline(string *__return_storage_ptr__,Serial *this,size_t size,string *eol)

{
  string *size_00;
  string local_50;
  undefined1 local_29;
  string *local_28;
  string *eol_local;
  size_t size_local;
  Serial *this_local;
  string *buffer;
  
  local_29 = 0;
  local_28 = eol;
  eol_local = (string *)size;
  size_local = (size_t)this;
  this_local = (Serial *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  size_00 = eol_local;
  std::__cxx11::string::string((string *)&local_50,(string *)eol);
  readline(this,__return_storage_ptr__,(size_t)size_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string
Serial::readline (size_t size, string eol)
{
  std::string buffer;
  this->readline (buffer, size, eol);
  return buffer;
}